

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O1

int asn1_template_ex_i2d
              (ASN1_VALUE **pval,uchar **out,ASN1_TEMPLATE *tt,int tag,int iclass,int optional)

{
  uint uVar1;
  ASN1_ITEM *it;
  uchar **ppuVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  ASN1_VALUE *orig_ptr;
  void *__base;
  int iVar8;
  int iVar9;
  ulong uVar10;
  OPENSSL_STACK *pOVar11;
  int *piVar12;
  bool bVar13;
  uint8_t *p;
  ASN1_VALUE *skitem;
  ASN1_VALUE *local_70;
  OPENSSL_STACK *local_68;
  ASN1_VALUE *local_60;
  void *local_58;
  uint local_50;
  uint local_4c;
  uchar **local_48;
  ASN1_VALUE *local_40;
  ASN1_VALUE *local_38;
  
  if ((iclass & 0xc0U) != iclass) {
    __assert_fail("(iclass & ASN1_TFLG_TAG_CLASS) == iclass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0xf0,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  if (iclass != 0 && tag == -1) {
    __assert_fail("tag != -1 || iclass == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0xf2,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  uVar1 = tt->flags;
  if ((uVar1 & 0x18) == 0) {
    uVar3 = 0;
    if (tag != -1) {
      uVar3 = iclass & 0xc0U;
    }
  }
  else {
    if (tag != -1) {
      iVar5 = 0xc1;
      iVar9 = 0xfa;
      goto LAB_00314aaa;
    }
    tag = tt->tag;
    uVar3 = uVar1 & 0xc0;
  }
  if (((byte)uVar1 & optional != 0) == 1) {
    __assert_fail("!optional || (flags & ASN1_TFLG_OPTIONAL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x10d,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  uVar4 = (uint)(optional != 0 || (uVar1 & 1) != 0);
  if ((uVar1 & 6) == 0) {
    if ((uVar1 & 0x10) == 0) {
      iVar5 = asn1_item_ex_i2d_opt(pval,out,tt->item,tag,uVar3,uVar4);
      return iVar5;
    }
    iVar5 = asn1_item_ex_i2d_opt(pval,(uchar **)0x0,tt->item,-1,0,uVar4);
    if (0 < iVar5) {
      iVar9 = ASN1_object_size(1,iVar5,tag);
      if ((out != (uchar **)0x0) && (iVar9 != -1)) {
        ASN1_put_object(out,1,iVar5,tag,uVar3);
        iVar5 = ASN1_item_ex_i2d((ASN1_VALUE **)pval,out,(ASN1_ITEM *)tt->item,-1,0);
        if (iVar5 < 0) {
          return -1;
        }
      }
      return iVar9;
    }
    return iVar5;
  }
  pOVar11 = (OPENSSL_STACK *)*pval;
  if (pOVar11 == (OPENSSL_STACK *)0x0) {
    if (uVar4 != 0) {
      return 0;
    }
    iVar5 = 0x9b;
    iVar9 = 0x11e;
LAB_00314aaa:
    ERR_put_error(0xc,0,iVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,iVar9);
    return -1;
  }
  iVar5 = 0x10;
  local_48 = out;
  if (((uVar1 & 2) != 0) && (iVar5 = 0x11, (uVar1 & 4) != 0)) {
    __assert_fail("(flags & ASN1_TFLG_SEQUENCE_OF) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x126,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  bVar13 = (uVar1 & 0x10) == 0;
  iVar9 = 0;
  local_58 = (void *)CONCAT44(local_58._4_4_,tag);
  if (tag != -1 && bVar13) {
    iVar5 = tag;
  }
  local_60 = (ASN1_VALUE *)CONCAT44(local_60._4_4_,iVar5);
  local_4c = 0;
  if (tag != -1 && bVar13) {
    local_4c = uVar3;
  }
  local_50 = uVar3;
  sVar6 = OPENSSL_sk_num(pOVar11);
  if (sVar6 != 0) {
    iVar9 = 0;
    sVar6 = 0;
    do {
      local_40 = (ASN1_VALUE *)OPENSSL_sk_value(pOVar11,sVar6);
      uVar3 = ASN1_item_ex_i2d(&local_40,(uchar **)0x0,(ASN1_ITEM *)tt->item,-1,0);
      if (uVar3 == 0xffffffff) {
        return -1;
      }
      if ((int)(uVar3 ^ 0x7fffffff) < iVar9) {
        return -1;
      }
      iVar9 = iVar9 + uVar3;
      sVar6 = sVar6 + 1;
      sVar7 = OPENSSL_sk_num(pOVar11);
    } while (sVar6 < sVar7);
  }
  uVar3 = ASN1_object_size(1,iVar9,(int)local_60);
  if (uVar3 == 0xffffffff) {
    return -1;
  }
  iVar5 = (int)local_58;
  uVar4 = uVar3;
  local_68 = pOVar11;
  if ((uVar1 & 0x10) != 0) {
    uVar4 = ASN1_object_size(1,uVar3,(int)local_58);
  }
  ppuVar2 = local_48;
  if (local_48 == (uchar **)0x0) {
    return uVar4;
  }
  if (uVar4 == 0xffffffff) {
    return -1;
  }
  if ((uVar1 & 0x10) != 0) {
    ASN1_put_object(local_48,1,uVar3,iVar5,local_50);
  }
  ASN1_put_object(ppuVar2,1,iVar9,(int)local_60,local_4c);
  it = (ASN1_ITEM *)tt->item;
  if (((uVar1 & 2) == 0) || (sVar6 = OPENSSL_sk_num(local_68), sVar6 < 2)) {
    pOVar11 = local_68;
    sVar6 = OPENSSL_sk_num(local_68);
    bVar13 = sVar6 == 0;
    if (!bVar13) {
      local_70 = (ASN1_VALUE *)OPENSSL_sk_value(pOVar11,0);
      iVar5 = ASN1_item_ex_i2d(&local_70,ppuVar2,it,-1,0);
      if (-1 < iVar5) {
        uVar10 = 1;
        do {
          sVar6 = OPENSSL_sk_num(pOVar11);
          bVar13 = sVar6 <= uVar10;
          if (bVar13) break;
          local_70 = (ASN1_VALUE *)OPENSSL_sk_value(pOVar11,uVar10);
          iVar5 = ASN1_item_ex_i2d(&local_70,ppuVar2,it,-1,0);
          uVar10 = uVar10 + 1;
        } while (-1 < iVar5);
      }
    }
  }
  else {
    orig_ptr = (ASN1_VALUE *)OPENSSL_malloc((long)iVar9);
    sVar6 = OPENSSL_sk_num(local_68);
    __base = OPENSSL_calloc(sVar6,0x10);
    bVar13 = false;
    local_70 = orig_ptr;
    if ((__base != (void *)0x0) && (orig_ptr != (ASN1_VALUE *)0x0)) {
      local_60 = orig_ptr;
      sVar6 = OPENSSL_sk_num(local_68);
      local_58 = __base;
      if (sVar6 != 0) {
        piVar12 = (int *)((long)__base + 8);
        sVar6 = 0;
        pOVar11 = local_68;
        do {
          local_38 = (ASN1_VALUE *)OPENSSL_sk_value(pOVar11,sVar6);
          *(ASN1_VALUE **)(piVar12 + -2) = local_70;
          iVar5 = ASN1_item_ex_i2d(&local_38,(uchar **)&local_70,it,-1,0);
          pOVar11 = local_68;
          *piVar12 = iVar5;
          if (iVar5 < 0) {
            iVar8 = 5;
          }
          else {
            iVar8 = 0;
            if ((long)iVar9 < (long)local_70 - (long)local_60) {
              __assert_fail("p - buf <= skcontlen",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                            ,0x1b0,
                            "int asn1_set_seq_out(struct stack_st_ASN1_VALUE *, unsigned char **, int, const ASN1_ITEM *, int)"
                           );
            }
          }
          if (iVar5 < 0) goto LAB_00314ee3;
          sVar6 = sVar6 + 1;
          sVar7 = OPENSSL_sk_num(local_68);
          piVar12 = piVar12 + 4;
        } while (sVar6 < sVar7);
      }
      iVar8 = 6;
LAB_00314ee3:
      __base = local_58;
      orig_ptr = local_60;
      pOVar11 = local_68;
      if (iVar8 != 5) {
        if (iVar8 != 6) goto LAB_00314fa1;
        sVar6 = OPENSSL_sk_num(local_68);
        qsort(__base,sVar6,0x10,der_cmp);
        ppuVar2 = local_48;
        local_70 = (ASN1_VALUE *)*local_48;
        sVar6 = OPENSSL_sk_num(pOVar11);
        if (sVar6 != 0) {
          piVar12 = (int *)((long)__base + 8);
          uVar10 = 0;
          do {
            if ((long)*piVar12 != 0) {
              memcpy(local_70,*(void **)(piVar12 + -2),(long)*piVar12);
            }
            local_70 = local_70 + *piVar12;
            uVar10 = uVar10 + 1;
            sVar6 = OPENSSL_sk_num(local_68);
            piVar12 = piVar12 + 4;
          } while (uVar10 < sVar6);
        }
        *ppuVar2 = (uchar *)local_70;
        bVar13 = true;
      }
    }
    OPENSSL_free(__base);
    OPENSSL_free(orig_ptr);
  }
LAB_00314fa1:
  return uVar4 | -(uint)!bVar13;
}

Assistant:

static int asn1_template_ex_i2d(ASN1_VALUE **pval, unsigned char **out,
                                const ASN1_TEMPLATE *tt, int tag, int iclass,
                                int optional) {
  int i, ret, ttag, tclass;
  size_t j;
  uint32_t flags = tt->flags;

  // Historically, |iclass| was repurposed to pass additional flags into the
  // encoding process.
  assert((iclass & ASN1_TFLG_TAG_CLASS) == iclass);
  // If not overridding the tag, |iclass| is ignored and should be zero.
  assert(tag != -1 || iclass == 0);

  // Work out tag and class to use: tagging may come either from the
  // template or the arguments, not both because this would create
  // ambiguity.
  if (flags & ASN1_TFLG_TAG_MASK) {
    // Error if argument and template tagging
    if (tag != -1) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
      return -1;
    }
    // Get tagging from template
    ttag = tt->tag;
    tclass = flags & ASN1_TFLG_TAG_CLASS;
  } else if (tag != -1) {
    // No template tagging, get from arguments
    ttag = tag;
    tclass = iclass & ASN1_TFLG_TAG_CLASS;
  } else {
    ttag = -1;
    tclass = 0;
  }

  // The template may itself by marked as optional, or this may be the template
  // of an |ASN1_ITEM_TEMPLATE| type which was contained inside an outer
  // optional template. (They cannot both be true because the
  // |ASN1_ITEM_TEMPLATE| codepath rejects optional templates.)
  assert(!optional || (flags & ASN1_TFLG_OPTIONAL) == 0);
  optional = optional || (flags & ASN1_TFLG_OPTIONAL) != 0;

  // At this point 'ttag' contains the outer tag to use, and 'tclass' is the
  // class.

  if (flags & ASN1_TFLG_SK_MASK) {
    // SET OF, SEQUENCE OF
    STACK_OF(ASN1_VALUE) *sk = (STACK_OF(ASN1_VALUE) *)*pval;
    int isset, sktag, skaclass;
    int skcontlen, sklen;
    ASN1_VALUE *skitem;

    if (!*pval) {
      if (optional) {
        return 0;
      }
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
      return -1;
    }

    if (flags & ASN1_TFLG_SET_OF) {
      isset = 1;
      // Historically, types with both bits set were mutated when
      // serialized to apply the sort. We no longer support this.
      assert((flags & ASN1_TFLG_SEQUENCE_OF) == 0);
    } else {
      isset = 0;
    }

    // Work out inner tag value: if EXPLICIT or no tagging use underlying
    // type.
    if ((ttag != -1) && !(flags & ASN1_TFLG_EXPTAG)) {
      sktag = ttag;
      skaclass = tclass;
    } else {
      skaclass = V_ASN1_UNIVERSAL;
      if (isset) {
        sktag = V_ASN1_SET;
      } else {
        sktag = V_ASN1_SEQUENCE;
      }
    }

    // Determine total length of items
    skcontlen = 0;
    for (j = 0; j < sk_ASN1_VALUE_num(sk); j++) {
      int tmplen;
      skitem = sk_ASN1_VALUE_value(sk, j);
      tmplen = ASN1_item_ex_i2d(&skitem, NULL, ASN1_ITEM_ptr(tt->item), -1, 0);
      if (tmplen == -1 || (skcontlen > INT_MAX - tmplen)) {
        return -1;
      }
      skcontlen += tmplen;
    }
    sklen = ASN1_object_size(/*constructed=*/1, skcontlen, sktag);
    if (sklen == -1) {
      return -1;
    }
    // If EXPLICIT need length of surrounding tag
    if (flags & ASN1_TFLG_EXPTAG) {
      ret = ASN1_object_size(/*constructed=*/1, sklen, ttag);
    } else {
      ret = sklen;
    }

    if (!out || ret == -1) {
      return ret;
    }

    // Now encode this lot...
    // EXPLICIT tag
    if (flags & ASN1_TFLG_EXPTAG) {
      ASN1_put_object(out, /*constructed=*/1, sklen, ttag, tclass);
    }
    // SET or SEQUENCE and IMPLICIT tag
    ASN1_put_object(out, /*constructed=*/1, skcontlen, sktag, skaclass);
    // And the stuff itself
    if (!asn1_set_seq_out(sk, out, skcontlen, ASN1_ITEM_ptr(tt->item), isset)) {
      return -1;
    }
    return ret;
  }

  if (flags & ASN1_TFLG_EXPTAG) {
    // EXPLICIT tagging
    // Find length of tagged item
    i = asn1_item_ex_i2d_opt(pval, NULL, ASN1_ITEM_ptr(tt->item), -1, 0,
                             optional);
    if (i <= 0) {
      return i;
    }
    // Find length of EXPLICIT tag
    ret = ASN1_object_size(/*constructed=*/1, i, ttag);
    if (out && ret != -1) {
      // Output tag and item
      ASN1_put_object(out, /*constructed=*/1, i, ttag, tclass);
      if (ASN1_item_ex_i2d(pval, out, ASN1_ITEM_ptr(tt->item), -1, 0) < 0) {
        return -1;
      }
    }
    return ret;
  }

  // Either normal or IMPLICIT tagging
  return asn1_item_ex_i2d_opt(pval, out, ASN1_ITEM_ptr(tt->item), ttag, tclass,
                              optional);
}